

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

void __thiscall
google::protobuf::UnknownFieldSet::MergeFrom(UnknownFieldSet *this,UnknownFieldSet *other)

{
  vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *this_00;
  anon_union_8_5_912831f5_for_data_ aVar1;
  uint32 uVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  UnknownField *__args;
  iterator __position;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  
  pvVar3 = other->fields_;
  if (pvVar3 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (uint)((ulong)((long)(pvVar3->
                                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar3->
                                super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 4);
  }
  if (0 < (int)uVar4) {
    if (this->fields_ ==
        (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
        0x0) {
      pvVar3 = (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                *)operator_new(0x18);
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this->fields_ = pvVar3;
    }
    uVar6 = 1;
    if (1 < (int)uVar4) {
      uVar6 = (ulong)uVar4;
    }
    lVar5 = 0;
    do {
      this_00 = (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>
                 *)this->fields_;
      __args = (UnknownField *)
               ((long)&((other->fields_->
                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                        )._M_impl.super__Vector_impl_data._M_start)->number_ + lVar5);
      __position._M_current = *(UnknownField **)(this_00 + 8);
      if (__position._M_current == *(UnknownField **)(this_00 + 0x10)) {
        std::vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>::
        _M_realloc_insert<google::protobuf::UnknownField_const&>(this_00,__position,__args);
      }
      else {
        uVar2 = __args->type_;
        aVar1 = __args->data_;
        (__position._M_current)->number_ = __args->number_;
        (__position._M_current)->type_ = uVar2;
        (__position._M_current)->data_ = aVar1;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
      }
      UnknownField::DeepCopy
                ((this->fields_->
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 )._M_impl.super__Vector_impl_data._M_finish + -1,__position._M_current);
      lVar5 = lVar5 + 0x10;
    } while (uVar6 * 0x10 != lVar5);
  }
  return;
}

Assistant:

void UnknownFieldSet::MergeFrom(const UnknownFieldSet& other) {
  int other_field_count = other.field_count();
  if (other_field_count > 0) {
    if (fields_ == NULL) fields_ = new std::vector<UnknownField>();
    for (int i = 0; i < other_field_count; i++) {
      fields_->push_back((*other.fields_)[i]);
      fields_->back().DeepCopy((*other.fields_)[i]);
    }
  }
}